

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O2

date_t __thiscall
duckdb::DateTruncBinaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t>
          (DateTruncBinaryOperator *this,string_t specifier,date_t date)

{
  undefined1 uVar1;
  bool bVar2;
  date_t input;
  NotImplementedException *this_00;
  allocator local_69;
  string local_68;
  string local_48 [32];
  string_t specifier_local;
  
  specifier_local.value.pointer.ptr = (char *)specifier.value._0_8_;
  input.days = specifier.value._8_4_;
  specifier_local.value._0_8_ = this;
  string_t::GetString_abi_cxx11_(&local_68,&specifier_local);
  uVar1 = duckdb::GetDatePartSpecifier((string *)&local_68);
  bVar2 = duckdb::Value::IsFinite<duckdb::date_t>(input);
  if (bVar2) {
    switch(uVar1) {
    case 0:
      input = DateTrunc::YearOperator::Operation<duckdb::date_t,duckdb::date_t>(input);
      break;
    case 1:
      input = DateTrunc::MonthOperator::Operation<duckdb::date_t,duckdb::date_t>(input);
      break;
    case 2:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0x10:
    case 0x16:
    case 0x17:
      break;
    case 3:
      input = DateTrunc::DecadeOperator::Operation<duckdb::date_t,duckdb::date_t>(input);
      break;
    case 4:
      input = DateTrunc::CenturyOperator::Operation<duckdb::date_t,duckdb::date_t>(input);
      break;
    case 5:
      input = DateTrunc::MillenniumOperator::Operation<duckdb::date_t,duckdb::date_t>(input);
      break;
    case 0xd:
    case 0x11:
      input.days = duckdb::Date::GetMondayOfCurrentWeek(input);
      break;
    case 0xe:
      input = DateTrunc::ISOYearOperator::Operation<duckdb::date_t,duckdb::date_t>(input);
      break;
    case 0xf:
      input = DateTrunc::QuarterOperator::Operation<duckdb::date_t,duckdb::date_t>(input);
      break;
    default:
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                (local_48,"Specifier type not implemented for DATETRUNC",&local_69);
      duckdb::NotImplementedException::NotImplementedException(this_00,local_48);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    input = Cast::Operation<duckdb::date_t,duckdb::date_t>(input);
  }
  std::__cxx11::string::~string((string *)&local_68);
  return (date_t)input.days;
}

Assistant:

static inline TR Operation(TA specifier, TB date) {
		return TruncateElement<TB, TR>(GetDatePartSpecifier(specifier.GetString()), date);
	}